

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

bool QAuthenticatorPrivate::isMethodSupported(QByteArrayView method)

{
  long lVar1;
  anon_class_16_1_60e9c21f_for__M_pred __pred;
  bool bVar2;
  qsizetype qVar3;
  storage_type *in_RSI;
  storage_type *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  qsizetype separator;
  anon_class_16_1_60e9c21f_for__M_pred isSupported;
  QByteArrayView *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  char (*__last) [10];
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  storage_type *local_28;
  storage_type *local_20;
  storage_type *local_18;
  storage_type *psStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QByteArrayView::indexOf
                    ((QByteArrayView *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                     ,(char)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
                     (qsizetype)in_stack_ffffffffffffff98);
  local_18 = in_RDI;
  psStack_10 = in_RSI;
  if (qVar3 != -1) {
    QVar4 = QByteArrayView::first(in_stack_ffffffffffffff98,0x2057df);
    local_28 = (storage_type *)QVar4.m_size;
    local_18 = local_28;
    local_20 = QVar4.m_data;
    psStack_10 = local_20;
  }
  __last = isMethodSupported::methods;
  std::size<char[10],4ul>(&isMethodSupported::methods);
  __pred.method.m_data = local_18;
  __pred.method.m_size = (qsizetype)psStack_10;
  bVar2 = std::
          any_of<char_const(*)[10],QAuthenticatorPrivate::isMethodSupported(QByteArrayView)::__0>
                    ((char (*) [10])CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                     __last,__pred);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAuthenticatorPrivate::isMethodSupported(QByteArrayView method)
{
    Q_ASSERT(!method.startsWith(' ')); // This should be trimmed during parsing
    auto separator = method.indexOf(' ');
    if (separator != -1)
        method = method.first(separator);
    const auto isSupported = [method](QByteArrayView reference) {
        return method.compare(reference, Qt::CaseInsensitive) == 0;
    };
    static const char methods[][10] = {
        "basic",
        "ntlm",
        "digest",
#if QT_CONFIG(sspi) || QT_CONFIG(gssapi)
        "negotiate",
#endif
    };
    return std::any_of(methods, methods + std::size(methods), isSupported);
}